

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::VectorDCE::RewriteInstructions
          (VectorDCE *this,Function *function,LiveComponentMap *live_components)

{
  bool bVar1;
  pointer ppIVar2;
  long *plVar3;
  pointer ppIVar4;
  bool modified;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> dead_dbg_value
  ;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  bool *local_78;
  VectorDCE *pVStack_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_std::allocator<std::pair<const_unsigned_int,_spvtools::utils::BitVector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_30;
  
  local_78 = &modified;
  modified = false;
  dead_dbg_value.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dead_dbg_value.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dead_dbg_value.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pVStack_70 = this;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_std::allocator<std::pair<const_unsigned_int,_spvtools::utils::BitVector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_68,&live_components->_M_h);
  local_98._8_8_ = 0;
  local_30 = &dead_dbg_value;
  plVar3 = (long *)::operator_new(0x50);
  *plVar3 = (long)local_78;
  plVar3[1] = (long)pVStack_70;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_std::allocator<std::pair<const_unsigned_int,_spvtools::utils::BitVector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_std::allocator<std::pair<const_unsigned_int,_spvtools::utils::BitVector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)(plVar3 + 2),&local_68);
  plVar3[9] = (long)local_30;
  local_80 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/vector_dce.cpp:321:25)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/vector_dce.cpp:321:25)>
             ::_M_manager;
  local_98._M_unused._M_object = plVar3;
  opt::Function::ForEachInst
            (function,(function<void_(spvtools::opt::Instruction_*)> *)&local_98,false,false);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_std::allocator<std::pair<const_unsigned_int,_spvtools::utils::BitVector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  ppIVar2 = dead_dbg_value.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar4 = dead_dbg_value.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; bVar1 = modified, ppIVar4 != ppIVar2;
      ppIVar4 = ppIVar4 + 1) {
    IRContext::KillInst((this->super_MemPass).super_Pass.context_,*ppIVar4);
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&dead_dbg_value.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  return bVar1;
}

Assistant:

bool VectorDCE::RewriteInstructions(
    Function* function, const VectorDCE::LiveComponentMap& live_components) {
  bool modified = false;

  // Kill DebugValue in the middle of the instruction iteration will result
  // in accessing a dangling pointer. We keep dead DebugValue instructions
  // in |dead_dbg_value| to kill them once after the iteration.
  std::vector<Instruction*> dead_dbg_value;

  function->ForEachInst([&modified, this, live_components,
                         &dead_dbg_value](Instruction* current_inst) {
    if (!context()->IsCombinatorInstruction(current_inst)) {
      return;
    }

    auto live_component = live_components.find(current_inst->result_id());
    if (live_component == live_components.end()) {
      // If this instruction is not in live_components then it does not
      // produce a vector, or it is never referenced and ADCE will remove
      // it.  No point in trying to differentiate.
      return;
    }

    // If no element in the current instruction is used replace it with an
    // OpUndef.
    if (live_component->second.Empty()) {
      modified = true;
      MarkDebugValueUsesAsDead(current_inst, &dead_dbg_value);
      uint32_t undef_id = this->Type2Undef(current_inst->type_id());
      context()->KillNamesAndDecorates(current_inst);
      context()->ReplaceAllUsesWith(current_inst->result_id(), undef_id);
      context()->KillInst(current_inst);
      return;
    }

    switch (current_inst->opcode()) {
      case spv::Op::OpCompositeInsert:
        modified |= RewriteInsertInstruction(
            current_inst, live_component->second, &dead_dbg_value);
        break;
      case spv::Op::OpCompositeConstruct:
        // TODO: The members that are not live can be replaced by an undef
        // or constant. This will remove uses of those values, and possibly
        // create opportunities for ADCE.
        break;
      default:
        // Do nothing.
        break;
    }
  });
  for (auto* i : dead_dbg_value) context()->KillInst(i);
  return modified;
}